

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall DSBarInfo::Tick(DSBarInfo *this)

{
  SBarInfoMainBlock *pSVar1;
  bool bVar2;
  int __oflag;
  player_t *player;
  DSBarInfo *this_local;
  
  DBaseStatusBar::Tick(&this->super_DBaseStatusBar);
  player = (this->super_DBaseStatusBar).CPlayer;
  FMugShot::Tick(&this->script->MugShot,player);
  if (this->currentPopup != 0) {
    Popup::tick((Popup *)&this->script->popups[this->currentPopup + -1].transition);
    if ((((this->script->popups[this->currentPopup + -1].opened & 1U) == 0) &&
        (bVar2 = Popup::isDoneMoving((Popup *)&this->script->popups[this->currentPopup + -1].
                                               transition), bVar2)) &&
       (this->currentPopup = this->pendingPopup, this->currentPopup != 0)) {
      Popup::open((Popup *)&this->script->popups[this->currentPopup + -1].transition,(char *)player,
                  __oflag);
    }
    if (this->lastPopup != (SBarInfoMainBlock *)0x0) {
      (*(this->lastPopup->super_SBarInfoCommandFlowControl).super_SBarInfoCommand.
        _vptr_SBarInfoCommand[5])(this->lastPopup,0,this,0);
    }
  }
  if (this->lastHud != -1) {
    pSVar1 = this->script->huds[this->lastHud];
    (*(pSVar1->super_SBarInfoCommandFlowControl).super_SBarInfoCommand._vptr_SBarInfoCommand[5])
              (pSVar1,0,this,0);
  }
  if ((this->lastInventoryBar != (SBarInfoMainBlock *)0x0) &&
     (0 < ((this->super_DBaseStatusBar).CPlayer)->inventorytics)) {
    (*(this->lastInventoryBar->super_SBarInfoCommandFlowControl).super_SBarInfoCommand.
      _vptr_SBarInfoCommand[5])(this->lastInventoryBar,0,this,0);
  }
  return;
}

Assistant:

void Tick ()
	{
		DBaseStatusBar::Tick();

		script->MugShot.Tick(CPlayer);
		if(currentPopup != POP_None)
		{
			script->popups[currentPopup-1].tick();
			if(script->popups[currentPopup-1].opened == false && script->popups[currentPopup-1].isDoneMoving())
			{
				currentPopup = pendingPopup;
				if(currentPopup != POP_None)
					script->popups[currentPopup-1].open();
			}

			if (lastPopup != NULL) lastPopup->Tick(NULL, this, false);
		}

		if(lastHud != -1)
			script->huds[lastHud]->Tick(NULL, this, false);
		if(lastInventoryBar != NULL && CPlayer->inventorytics > 0)
			lastInventoryBar->Tick(NULL, this, false);
	}